

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

Vec_Int_t * Gia_ManDfsCollect(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *vObjs;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = p->nObjs;
  vObjs = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vObjs->nSize = 0;
  vObjs->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  vObjs->pArray = piVar2;
  Gia_ManIncrementTravId(p);
  pVVar3 = p->vCos;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      iVar1 = pVVar3->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0021b50d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManDfsCollect_rec(p,p->pObjs + iVar1,vObjs);
      lVar5 = lVar5 + 1;
      pVVar3 = p->vCos;
    } while (lVar5 < pVVar3->nSize);
  }
  pVVar3 = p->vCis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      iVar1 = pVVar3->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0021b50d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return vObjs;
      }
      Gia_ManDfsCollect_rec(p,p->pObjs + iVar1,vObjs);
      lVar5 = lVar5 + 1;
      pVVar3 = p->vCis;
    } while (lVar5 < pVVar3->nSize);
  }
  return vObjs;
}

Assistant:

Vec_Int_t * Gia_ManDfsCollect( Gia_Man_t * p )
{
    Vec_Int_t * vObjs = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; int i;
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDfsCollect_rec( p, pObj, vObjs );
    Gia_ManForEachCi( p, pObj, i )
        Gia_ManDfsCollect_rec( p, pObj, vObjs );
    return vObjs;
}